

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

ArenaBlock * __thiscall
google::protobuf::internal::ThreadSafeArena::FirstBlock
          (ThreadSafeArena *this,void *buf,size_t size,AllocationPolicy *policy)

{
  bool bVar1;
  char *failure_msg;
  LogMessage *pLVar2;
  SizedPtr SVar3;
  ThreadSafeArena *local_88;
  void *local_80;
  ThreadSafeArena *local_78;
  SizedPtr mem;
  LogMessage local_58;
  Voidify local_45;
  uint local_44;
  unsigned_long local_40;
  Nullable<const_char_*> local_38;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  AllocationPolicy *policy_local;
  size_t size_local;
  void *buf_local;
  ThreadSafeArena *this_local;
  
  absl_log_internal_check_op_result = (Nullable<const_char_*>)policy;
  policy_local = (AllocationPolicy *)size;
  size_local = (size_t)buf;
  buf_local = this;
  bVar1 = AllocationPolicy::IsDefault(policy);
  if (bVar1) {
    this_local = (ThreadSafeArena *)FirstBlock(this,(void *)size_local,(size_t)policy_local);
  }
  else {
    local_40 = absl::lts_20250127::log_internal::GetReferenceableValue(size_local & 7);
    local_44 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
    local_38 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_long,unsigned_int>
                         (&local_40,&local_44,"reinterpret_cast<uintptr_t>(buf) & 7 == 0u");
    if (local_38 != (Nullable<const_char_*>)0x0) {
      failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_38);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena.cc"
                 ,0x255,failure_msg);
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_45,pLVar2);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_58);
    }
    if ((size_local == 0) || (policy_local < (AllocationPolicy *)0x30)) {
      SVar3 = anon_unknown_12::AllocateBlock
                        ((AllocationPolicy *)absl_log_internal_check_op_result,0,0x20);
      local_88 = (ThreadSafeArena *)SVar3.p;
      local_78 = local_88;
      local_80 = (void *)SVar3.n;
      mem.p = local_80;
    }
    else {
      local_78 = (ThreadSafeArena *)size_local;
      mem.p = policy_local;
      if (policy_local != (AllocationPolicy *)0x0) {
        *(undefined1 *)size_local = 0;
        *(undefined1 *)((long)policy_local + (size_local - 1)) = 0;
      }
      TaggedAllocationPolicyPtr::set_is_user_owned_initial_block(&this->alloc_policy_,true);
    }
    ArenaBlock::ArenaBlock((ArenaBlock *)local_78,(ArenaBlock *)0x0,(size_t)mem.p);
    this_local = local_78;
  }
  return (ArenaBlock *)this_local;
}

Assistant:

ArenaBlock* ThreadSafeArena::FirstBlock(void* buf, size_t size,
                                        const AllocationPolicy& policy) {
  if (policy.IsDefault()) return FirstBlock(buf, size);

  ABSL_DCHECK_EQ(reinterpret_cast<uintptr_t>(buf) & 7, 0u);

  SizedPtr mem;
  if (buf == nullptr || size < kBlockHeaderSize + kAllocPolicySize) {
    mem = AllocateBlock(&policy, 0, kAllocPolicySize);
  } else {
    mem = {buf, size};
    // Record user-owned block.
    if constexpr (internal::PerformDebugChecks()) {
      // Touch block to verify it is addressable.
      if (size > 0) {
        static_cast<char*>(buf)[0] = 0;
        static_cast<char*>(buf)[size - 1] = 0;
      }
    }
    ABSL_ANNOTATE_MEMORY_IS_UNINITIALIZED(buf, size);
    alloc_policy_.set_is_user_owned_initial_block(true);
  }

  return new (mem.p) ArenaBlock{nullptr, mem.n};
}